

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

void __thiscall
QTransposeProxyModelPrivate::onLayoutChanged
          (QTransposeProxyModelPrivate *this,QList<QPersistentModelIndex> *parents,
          LayoutChangeHint hint)

{
  bool bVar1;
  QTransposeProxyModel *this_00;
  QPersistentModelIndex *this_01;
  QList<QPersistentModelIndex> *in_RSI;
  QTransposeProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  LayoutChangeHint proxyHint;
  QPersistentModelIndex *srcParent;
  QList<QPersistentModelIndex> *__range1_1;
  QPersistentModelIndex *persistIdx;
  add_const_t<QList<QPersistentModelIndex>_> *__range1;
  QTransposeProxyModel *q;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QList<QPersistentModelIndex> proxyParents;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList toList;
  rvalue_ref in_stack_fffffffffffffe78;
  QList<QModelIndex> *in_stack_fffffffffffffe80;
  QTransposeProxyModel *in_stack_fffffffffffffe88;
  LayoutChangeHint _t2;
  QPersistentModelIndex *in_stack_fffffffffffffe90;
  QList<QModelIndex> *in_stack_fffffffffffffea8;
  QList<QPersistentModelIndex> *this_02;
  qsizetype in_stack_fffffffffffffee8;
  QModelIndexList *in_stack_fffffffffffffef8;
  QModelIndexList *in_stack_ffffffffffffff00;
  QTransposeProxyModel *pQVar2;
  undefined1 local_d8 [24];
  undefined1 local_c0 [32];
  QPersistentModelIndex *local_a0;
  const_iterator local_98;
  const_iterator local_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  QPersistentModelIndex *local_40;
  const_iterator local_38;
  const_iterator local_30;
  QList<QPersistentModelIndex> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = &local_28;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8b1040);
  QList<QPersistentModelIndex>::size(&in_RDI->layoutChangePersistentIndexes);
  QList<QModelIndex>::reserve(in_stack_fffffffffffffea8,in_stack_fffffffffffffee8);
  local_30.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QPersistentModelIndex>::begin
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe80);
  local_38.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QPersistentModelIndex>::end
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe80);
  while( true ) {
    local_40 = local_38.i;
    bVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_30,local_38);
    if (!bVar1) break;
    QList<QPersistentModelIndex>::const_iterator::operator*(&local_30);
    pQVar2 = this_00;
    QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_fffffffffffffe90);
    (*(this_00->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject._vptr_QObject
      [0x33])(local_58,this_00,local_70);
    QList<QModelIndex>::operator<<(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_30);
    this_00 = pQVar2;
  }
  QAbstractItemModel::changePersistentIndexList
            ((QAbstractItemModel *)this_00,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  QList<QModelIndex>::clear(in_stack_fffffffffffffe80);
  QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe80);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8b1230);
  QList<QPersistentModelIndex>::size(in_RSI);
  QList<QPersistentModelIndex>::reserve(this_02,(qsizetype)this_00);
  local_90.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_90 = QList<QPersistentModelIndex>::begin
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe80);
  local_98.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = QList<QPersistentModelIndex>::end
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe80);
  while( true ) {
    _t2 = (LayoutChangeHint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    local_a0 = local_98.i;
    bVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_90,local_98);
    if (!bVar1) break;
    in_stack_fffffffffffffe88 = this_00;
    this_01 = QList<QPersistentModelIndex>::const_iterator::operator*(&local_90);
    this_00 = in_stack_fffffffffffffe88;
    QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
    (*(in_stack_fffffffffffffe88->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject.
      _vptr_QObject[0x33])(local_c0,in_stack_fffffffffffffe88,local_d8);
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    QList<QPersistentModelIndex>::operator<<
              ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffe80,
               (rvalue_ref)in_stack_fffffffffffffe78);
    QPersistentModelIndex::~QPersistentModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffffe80);
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_90);
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)in_stack_fffffffffffffe80,
             (QList<QPersistentModelIndex> *)in_stack_fffffffffffffe78,_t2);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8b1441);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8b144e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTransposeProxyModelPrivate::onLayoutChanged(const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QTransposeProxyModel);
    Q_ASSERT(layoutChangeProxyIndexes.size() == layoutChangePersistentIndexes.size());
    QModelIndexList toList;
    toList.reserve(layoutChangePersistentIndexes.size());
    for (const QPersistentModelIndex &persistIdx : std::as_const(layoutChangePersistentIndexes))
        toList << q->mapFromSource(persistIdx);
    q->changePersistentIndexList(layoutChangeProxyIndexes, toList);
    layoutChangeProxyIndexes.clear();
    layoutChangePersistentIndexes.clear();
    QList<QPersistentModelIndex> proxyParents;
    proxyParents.reserve(parents.size());
    for (const QPersistentModelIndex &srcParent : parents)
        proxyParents << q->mapFromSource(srcParent);
    QAbstractItemModel::LayoutChangeHint proxyHint = QAbstractItemModel::NoLayoutChangeHint;
    if (hint == QAbstractItemModel::VerticalSortHint)
        proxyHint = QAbstractItemModel::HorizontalSortHint;
    else if (hint == QAbstractItemModel::HorizontalSortHint)
        proxyHint = QAbstractItemModel::VerticalSortHint;
    emit q->layoutChanged(proxyParents, proxyHint);
}